

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O3

void __thiscall
duckdb::BaseScanner::Process<duckdb::ColumnCountResult>(BaseScanner *this,ColumnCountResult *result)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar1;
  idx_t iVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  CSVState CVar6;
  CSVState CVar7;
  char cVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  CSVStates *pCVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  CSVStateMachine *pCVar17;
  CSVBufferHandle *pCVar18;
  reference pvVar19;
  idx_t iVar20;
  ulong uVar21;
  idx_t iVar22;
  
  this_00 = &this->state_machine;
  pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  cVar3 = (pCVar17->dialect_options).state_machine_options.escape.value;
  pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  if ((((pCVar17->state_machine_options).strict_mode.value == true) &&
      (pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
      (pCVar17->state_machine_options).strict_mode.set_by_user == true)) &&
     (pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar17->state_machine_options).new_line.value == CARRY_ON)) {
    pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    cVar4 = (pCVar17->state_machine_options).new_line.set_by_user;
  }
  else {
    cVar4 = '\0';
  }
  iVar9 = (this->iterator).pos.buffer_pos;
  if ((this->iterator).is_set == true) {
    iVar20 = (this->iterator).boundary.end_pos;
    pCVar18 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    if (iVar20 <= pCVar18->actual_size) goto LAB_017e82fb;
  }
  pCVar18 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
  iVar20 = pCVar18->actual_size;
LAB_017e82fb:
  uVar21 = (this->iterator).pos.buffer_pos;
  if (uVar21 < iVar20) {
    uVar1 = iVar20 - 1;
    do {
      pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar22 = (this->iterator).pos.buffer_pos;
      bVar5 = this->buffer_handle_ptr[iVar22];
      CVar6 = (this->states).states[1];
      (this->states).states[0] = CVar6;
      CVar7 = pCVar17->transition_array->state_machine[bVar5][CVar6];
      (this->states).states[1] = CVar7;
      if (ESCAPED_RETURN < CVar7) goto switchD_017e836c_caseD_2;
      switch(CVar7) {
      case STANDARD:
        iVar2 = iVar22 + 1;
        (this->iterator).pos.buffer_pos = iVar2;
        uVar21 = iVar22 + 9;
        while (uVar21 < iVar20) {
          uVar21 = *(ulong *)(this->buffer_handle_ptr + iVar2);
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar17->transition_array->delimiter;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar10 = pCVar17->transition_array->new_line;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar11 = pCVar17->transition_array->carriage_return;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar12 = pCVar17->transition_array->escape;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (uVar21 ^ pCVar17->transition_array->comment) &
                   (uVar12 ^ uVar21) & (uVar11 ^ uVar21) & (uVar10 ^ uVar21) & (uVar14 ^ uVar21);
          if ((~(0x101010101010100 - uVar21 | uVar21) & 0x8080808080808080) != 0) break;
          iVar22 = (this->iterator).pos.buffer_pos;
          iVar2 = iVar22 + 8;
          (this->iterator).pos.buffer_pos = iVar2;
          uVar21 = iVar22 + 0x10;
        }
        pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar21 = (this->iterator).pos.buffer_pos;
        if (uVar21 < uVar1) {
          cVar8 = pCVar17->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar21]];
          while (cVar8 != '\0') {
            (this->iterator).pos.buffer_pos = uVar21 + 1;
            pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            uVar21 = (this->iterator).pos.buffer_pos;
            if (uVar1 <= uVar21) break;
            cVar8 = pCVar17->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar21]];
          }
        }
        goto LAB_017e8673;
      case DELIMITER:
        result->current_column_count = result->current_column_count + 1;
        break;
      case RECORD_SEPARATOR:
        if (CVar6 == 0xb) {
LAB_017e84e0:
          this->lines_read = this->lines_read + 1;
        }
        else if (CVar6 != CARRIAGE_RETURN) {
          if (CVar6 == RECORD_SEPARATOR) goto LAB_017e84e0;
          bVar16 = (result->super_ScannerResult).comment;
          bVar15 = ColumnCountResult::AddRow(result,iVar22);
          if (bVar16 == true) {
            bVar16 = result->cur_line_starts_as_comment;
            pvVar19 = vector<duckdb::ColumnCount,_true>::operator[]
                                (&result->column_counts,result->result_position - 1);
            if (bVar16 == true) {
              pvVar19->is_comment = true;
            }
            else {
              pvVar19->is_mid_comment = true;
            }
            (result->super_ScannerResult).comment = false;
            result->cur_line_starts_as_comment = false;
          }
          if (bVar15) {
            iVar20 = (this->iterator).pos.buffer_pos + 1;
            (this->iterator).pos.buffer_pos = iVar20;
            this->bytes_read = iVar20 - iVar9;
            goto LAB_017e88db;
          }
          this->lines_read = this->lines_read + 1;
          iVar22 = (this->iterator).pos.buffer_pos;
        }
        break;
      case CARRIAGE_RETURN:
        if ((NOT_SET < CVar6) || ((0x860U >> (CVar6 & 0x1f) & 1) == 0)) {
          if ((result->super_ScannerResult).comment == true) {
            bVar15 = ColumnCountResult::AddRow(result,iVar22);
            bVar16 = result->cur_line_starts_as_comment;
            pvVar19 = vector<duckdb::ColumnCount,_true>::operator[]
                                (&result->column_counts,result->result_position - 1);
            if (bVar16 == true) {
              pvVar19->is_comment = true;
            }
            else {
              pvVar19->is_mid_comment = true;
            }
            (result->super_ScannerResult).comment = false;
            result->cur_line_starts_as_comment = false;
            iVar22 = (this->iterator).pos.buffer_pos;
            if (bVar15) {
LAB_017e88c8:
              (this->iterator).pos.buffer_pos = iVar22 + 1;
              this->bytes_read = (iVar22 + 1) - iVar9;
LAB_017e88db:
              this->lines_read = this->lines_read + 1;
              return;
            }
          }
          else if (cVar4 == '\0') {
            bVar16 = ColumnCountResult::AddRow(result,iVar22);
            iVar22 = (this->iterator).pos.buffer_pos;
            if (bVar16) goto LAB_017e88c8;
          }
        }
        uVar21 = iVar22 + 1;
        (this->iterator).pos.buffer_pos = uVar21;
        this->lines_read = this->lines_read + 1;
        goto LAB_017e8673;
      case QUOTED:
        if (((CVar6 == MAYBE_QUOTED) || (CVar6 == UNQUOTED)) && (cVar3 != '\0')) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        this->ever_quoted = true;
        if ((result->super_ScannerResult).quoted == false) {
          (result->super_ScannerResult).quoted_position = iVar22;
        }
        (result->super_ScannerResult).quoted = true;
        (result->super_ScannerResult).unquoted = true;
        iVar2 = iVar22 + 1;
        (this->iterator).pos.buffer_pos = iVar2;
        uVar21 = iVar22 + 9;
        while (uVar21 < iVar20) {
          uVar21 = *(ulong *)(this->buffer_handle_ptr + iVar2);
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar17->transition_array->quote;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (uVar21 ^ pCVar17->transition_array->escape) & (uVar14 ^ uVar21);
          if ((~(0x101010101010100 - uVar21 | uVar21) & 0x8080808080808080) != 0) break;
          iVar22 = (this->iterator).pos.buffer_pos;
          iVar2 = iVar22 + 8;
          (this->iterator).pos.buffer_pos = iVar2;
          uVar21 = iVar22 + 0x10;
        }
        pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar21 = (this->iterator).pos.buffer_pos;
        if (uVar21 < uVar1) {
          cVar8 = pCVar17->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar21]];
          while (cVar8 != '\0') {
            (this->iterator).pos.buffer_pos = uVar21 + 1;
            pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            uVar21 = (this->iterator).pos.buffer_pos;
            if (uVar1 <= uVar21) break;
            cVar8 = pCVar17->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar21]];
          }
        }
        goto LAB_017e8673;
      case UNQUOTED:
        if (CVar6 == MAYBE_QUOTED) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        pCVar13 = (result->super_ScannerResult).states;
        if (((pCVar13->states[0] == UNQUOTED) && (pCVar13->states[1] == UNQUOTED)) &&
           ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
            escape.value != '\0')) {
          (result->super_ScannerResult).escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        (result->super_ScannerResult).escaped = true;
        this->ever_escaped = true;
        break;
      case INVALID:
        result->result_position = 0;
        result->error = true;
        uVar21 = iVar22 + 1;
        (this->iterator).pos.buffer_pos = uVar21;
        goto LAB_017e8894;
      case COMMENT:
        if (((result->super_ScannerResult).states)->states[0] != STANDARD) {
          result->cur_line_starts_as_comment = true;
        }
        (result->super_ScannerResult).comment = true;
        iVar2 = iVar22 + 1;
        (this->iterator).pos.buffer_pos = iVar2;
        uVar21 = iVar22 + 9;
        while (uVar21 < iVar20) {
          uVar21 = *(ulong *)(this->buffer_handle_ptr + iVar2);
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar17->transition_array->new_line;
          pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (uVar21 ^ pCVar17->transition_array->carriage_return) & (uVar14 ^ uVar21);
          if ((~(0x101010101010100 - uVar21 | uVar21) & 0x8080808080808080) != 0) break;
          iVar22 = (this->iterator).pos.buffer_pos;
          iVar2 = iVar22 + 8;
          (this->iterator).pos.buffer_pos = iVar2;
          uVar21 = iVar22 + 0x10;
        }
        pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar21 = (this->iterator).pos.buffer_pos;
        if (uVar21 < uVar1) {
          cVar8 = pCVar17->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar21]];
          while (cVar8 != '\0') {
            (this->iterator).pos.buffer_pos = uVar21 + 1;
            pCVar17 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            uVar21 = (this->iterator).pos.buffer_pos;
            if (uVar1 <= uVar21) break;
            cVar8 = pCVar17->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar21]];
          }
        }
        goto LAB_017e8673;
      }
switchD_017e836c_caseD_2:
      uVar21 = iVar22 + 1;
      (this->iterator).pos.buffer_pos = uVar21;
LAB_017e8673:
    } while (uVar21 < iVar20);
  }
LAB_017e8894:
  this->bytes_read = uVar21 - iVar9;
  return;
}

Assistant:

void Process(T &result) {
		idx_t to_pos;
		const bool has_escaped_value = state_machine->dialect_options.state_machine_options.escape != '\0';
		const bool only_rn_newlines =
		    state_machine->state_machine_options.strict_mode.GetValue() &&
		    state_machine->state_machine_options.strict_mode.IsSetByUser() &&
		    state_machine->state_machine_options.new_line.GetValue() == NewLineIdentifier::CARRY_ON &&
		    state_machine->state_machine_options.new_line.IsSetByUser();
		const idx_t start_pos = iterator.pos.buffer_pos;
		if (iterator.IsBoundarySet()) {
			to_pos = iterator.GetEndPos();
			if (to_pos > cur_buffer_handle->actual_size) {
				to_pos = cur_buffer_handle->actual_size;
			}
		} else {
			to_pos = cur_buffer_handle->actual_size;
		}
		while (iterator.pos.buffer_pos < to_pos) {
			state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
			switch (states.states[1]) {
			case CSVState::INVALID:
				T::InvalidState(result);
				iterator.pos.buffer_pos++;
				bytes_read = iterator.pos.buffer_pos - start_pos;
				return;
			case CSVState::RECORD_SEPARATOR:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
					lines_read++;

				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
					lines_read++;
				}
				iterator.pos.buffer_pos++;
				break;
			case CSVState::CARRIAGE_RETURN:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else if (!only_rn_newlines) {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				break;
			case CSVState::DELIMITER:
				T::AddValue(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::QUOTED: {
				if ((states.states[0] == CSVState::UNQUOTED || states.states[0] == CSVState::MAYBE_QUOTED) &&
				    has_escaped_value) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				ever_quoted = true;
				T::SetQuoted(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.quote) &
					                     (value ^ state_machine->transition_array.escape))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}

				while (state_machine->transition_array
				           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
			} break;
			case CSVState::UNQUOTED: {
				if (states.states[0] == CSVState::MAYBE_QUOTED) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				T::SetUnquoted(result);
				iterator.pos.buffer_pos++;
				break;
			}
			case CSVState::ESCAPE:
			case CSVState::UNQUOTED_ESCAPE:
			case CSVState::ESCAPED_RETURN:
				T::SetEscaped(result);
				ever_escaped = true;
				iterator.pos.buffer_pos++;
				break;
			case CSVState::STANDARD: {
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.delimiter) &
					                     (value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return) &
					                     (value ^ state_machine->transition_array.escape) &
					                     (value ^ state_machine->transition_array.comment))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			case CSVState::QUOTED_NEW_LINE:
				T::QuotedNewLine(result);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::COMMENT: {
				T::SetComment(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			default:
				iterator.pos.buffer_pos++;
				break;
			}
		}
		bytes_read = iterator.pos.buffer_pos - start_pos;
	}